

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<double,_30>::TPZManVector(TPZManVector<double,_30> *this,int64_t size,double *copy)

{
  double *pdVar1;
  int64_t iVar2;
  long lVar3;
  
  TPZVec<double>::TPZVec(&this->super_TPZVec<double>,0);
  (this->super_TPZVec<double>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01997b30;
  if (size < 0x1f) {
    pdVar1 = this->fExtAlloc;
    iVar2 = 0;
  }
  else {
    pdVar1 = (double *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    iVar2 = size;
  }
  (this->super_TPZVec<double>).fStore = pdVar1;
  (this->super_TPZVec<double>).fNElements = size;
  (this->super_TPZVec<double>).fNAlloc = iVar2;
  if (0 < size) {
    pdVar1 = (this->super_TPZVec<double>).fStore;
    lVar3 = 0;
    do {
      pdVar1[lVar3] = *copy;
      lVar3 = lVar3 + 1;
    } while (size != lVar3);
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}